

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O2

void google::protobuf::util::internal::StatusOrHelper::Crash(Status *status)

{
  LogMessage *pLVar1;
  LogMessage local_78;
  string local_40;
  LogFinisher local_19;
  
  protobuf::internal::LogMessage::LogMessage
            (&local_78,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/statusor.cc"
             ,0x29);
  pLVar1 = protobuf::internal::LogMessage::operator<<
                     (&local_78,"Attempting to fetch value instead of handling error ");
  Status::ToString_abi_cxx11_(&local_40,status);
  pLVar1 = protobuf::internal::LogMessage::operator<<(pLVar1,&local_40);
  protobuf::internal::LogFinisher::operator=(&local_19,pLVar1);
  std::__cxx11::string::~string((string *)&local_40);
  protobuf::internal::LogMessage::~LogMessage(&local_78);
  return;
}

Assistant:

void StatusOrHelper::Crash(const Status& status) {
  GOOGLE_LOG(FATAL) << "Attempting to fetch value instead of handling error "
                    << status.ToString();
}